

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000021ffb0 = 0x2e2e2e2e2e2e2e;
    uRam000000000021ffb7._0_1_ = '.';
    uRam000000000021ffb7._1_1_ = '.';
    uRam000000000021ffb7._2_1_ = '.';
    uRam000000000021ffb7._3_1_ = '.';
    uRam000000000021ffb7._4_1_ = '.';
    uRam000000000021ffb7._5_1_ = '.';
    uRam000000000021ffb7._6_1_ = '.';
    uRam000000000021ffb7._7_1_ = '.';
    DAT_0021ffa0 = '.';
    DAT_0021ffa0_1._0_1_ = '.';
    DAT_0021ffa0_1._1_1_ = '.';
    DAT_0021ffa0_1._2_1_ = '.';
    DAT_0021ffa0_1._3_1_ = '.';
    DAT_0021ffa0_1._4_1_ = '.';
    DAT_0021ffa0_1._5_1_ = '.';
    DAT_0021ffa0_1._6_1_ = '.';
    uRam000000000021ffa8 = 0x2e2e2e2e2e2e2e;
    DAT_0021ffaf = 0x2e;
    DAT_0021ff90 = '.';
    DAT_0021ff90_1._0_1_ = '.';
    DAT_0021ff90_1._1_1_ = '.';
    DAT_0021ff90_1._2_1_ = '.';
    DAT_0021ff90_1._3_1_ = '.';
    DAT_0021ff90_1._4_1_ = '.';
    DAT_0021ff90_1._5_1_ = '.';
    DAT_0021ff90_1._6_1_ = '.';
    uRam000000000021ff98._0_1_ = '.';
    uRam000000000021ff98._1_1_ = '.';
    uRam000000000021ff98._2_1_ = '.';
    uRam000000000021ff98._3_1_ = '.';
    uRam000000000021ff98._4_1_ = '.';
    uRam000000000021ff98._5_1_ = '.';
    uRam000000000021ff98._6_1_ = '.';
    uRam000000000021ff98._7_1_ = '.';
    DAT_0021ff80 = '.';
    DAT_0021ff80_1._0_1_ = '.';
    DAT_0021ff80_1._1_1_ = '.';
    DAT_0021ff80_1._2_1_ = '.';
    DAT_0021ff80_1._3_1_ = '.';
    DAT_0021ff80_1._4_1_ = '.';
    DAT_0021ff80_1._5_1_ = '.';
    DAT_0021ff80_1._6_1_ = '.';
    uRam000000000021ff88._0_1_ = '.';
    uRam000000000021ff88._1_1_ = '.';
    uRam000000000021ff88._2_1_ = '.';
    uRam000000000021ff88._3_1_ = '.';
    uRam000000000021ff88._4_1_ = '.';
    uRam000000000021ff88._5_1_ = '.';
    uRam000000000021ff88._6_1_ = '.';
    uRam000000000021ff88._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000021ff78._0_1_ = '.';
    uRam000000000021ff78._1_1_ = '.';
    uRam000000000021ff78._2_1_ = '.';
    uRam000000000021ff78._3_1_ = '.';
    uRam000000000021ff78._4_1_ = '.';
    uRam000000000021ff78._5_1_ = '.';
    uRam000000000021ff78._6_1_ = '.';
    uRam000000000021ff78._7_1_ = '.';
    DAT_0021ffbf = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}